

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

bool_t tcsisame_ascii(tchar_t *a,tchar_t *b)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    bVar1 = a[lVar2];
    if (b[lVar2] == bVar1) {
      if (bVar1 == 0) {
        return 1;
      }
    }
    else {
      if (((b[lVar2] ^ bVar1) & 0xdf) != 0) {
        return 0;
      }
      if (((int)(char)bVar1 & 0xffffffdfU) - 0x5b < 0xffffffe6) {
        return 0;
      }
    }
    bVar1 = a[lVar2 + 1];
    if (b[lVar2 + 1] == bVar1) {
      if (bVar1 == 0) {
        return 1;
      }
    }
    else {
      if (((b[lVar2 + 1] ^ bVar1) & 0xdf) != 0) {
        return 0;
      }
      if (((int)(char)bVar1 & 0xffffffdfU) - 0x5b < 0xffffffe6) {
        return 0;
      }
    }
    bVar1 = a[lVar2 + 2];
    if (b[lVar2 + 2] == bVar1) {
      if (bVar1 == 0) {
        return 1;
      }
    }
    else {
      if (((b[lVar2 + 2] ^ bVar1) & 0xdf) != 0) {
        return 0;
      }
      if (((int)(char)bVar1 & 0xffffffdfU) - 0x5b < 0xffffffe6) {
        return 0;
      }
    }
    bVar1 = a[lVar2 + 3];
    if (b[lVar2 + 3] == bVar1) {
      if (bVar1 == 0) {
        return 1;
      }
    }
    else if ((((b[lVar2 + 3] ^ bVar1) & 0xdf) != 0) ||
            (((int)(char)bVar1 & 0xffffffdfU) - 0x5b < 0xffffffe6)) {
      return 0;
    }
    lVar2 = lVar2 + 4;
  } while( true );
}

Assistant:

bool_t tcsisame_ascii(const tchar_t* a,const tchar_t* b)
{
    int ca,cb;
    for (;;a+=4,b+=4)
    {
        isame_ascii(a,b,0)
        isame_ascii(a,b,1)
        isame_ascii(a,b,2)
        isame_ascii(a,b,3)
    }
    return 1;
}